

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cpp
# Opt level: O3

int ncnn::gru(Mat *bottom_blob,Mat *top_blob,int reverse,Mat *weight_xc,Mat *bias_c,Mat *weight_hc,
             Mat *hidden_state,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint _h;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  size_t sVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  int *piVar13;
  void *pvVar14;
  int i;
  uint uVar15;
  long lVar16;
  float *pfVar17;
  ulong uVar18;
  float *pfVar19;
  long lVar20;
  long lVar21;
  void *pvVar22;
  void *pvVar23;
  void *pvVar24;
  uint uVar25;
  long lVar26;
  void *pvVar27;
  void *pvVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  void *pvVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float *bias_c_U;
  float *bias_c_R;
  Mat local_78;
  
  uVar1 = bottom_blob->w;
  uVar2 = bottom_blob->h;
  _h = top_blob->w;
  uVar32 = (ulong)_h;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,2,_h,4,(Allocator *)opt);
  pvVar14 = local_78.data;
  iVar33 = -100;
  if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
    if (0 < (int)uVar2) {
      pvVar4 = bottom_blob->data;
      iVar33 = bottom_blob->w;
      sVar5 = bottom_blob->elemsize;
      lVar20 = (long)local_78.w * CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize);
      pvVar6 = bias_c->data;
      lVar16 = (long)bias_c->w * bias_c->elemsize;
      pvVar7 = weight_xc->data;
      pvVar8 = weight_hc->data;
      iVar3 = top_blob->w;
      sVar9 = top_blob->elemsize;
      pvVar10 = top_blob->data;
      lVar26 = (long)weight_xc->w * weight_xc->elemsize;
      lVar29 = (long)weight_hc->w * weight_hc->elemsize;
      pvVar11 = hidden_state->data;
      pfVar17 = (float *)((long)local_78.data + 4);
      uVar25 = 0;
      do {
        uVar15 = ~uVar25 + uVar2;
        if (reverse == 0) {
          uVar15 = uVar25;
        }
        if (0 < (int)_h) {
          lVar31 = (long)iVar33 * sVar5 * (long)(int)uVar15;
          pvVar12 = hidden_state->data;
          uVar30 = 0;
          pvVar22 = (void *)(lVar29 * (ulong)(_h * 2) + (long)pvVar8);
          pvVar23 = pvVar8;
          pvVar24 = (void *)((ulong)(_h * 2) * lVar26 + (long)pvVar7);
          pvVar27 = pvVar7;
          pvVar28 = (void *)(lVar26 * uVar32 + (long)pvVar7);
          pvVar34 = (void *)(lVar29 * uVar32 + (long)pvVar8);
          do {
            fVar37 = *(float *)((long)pvVar6 + uVar30 * 4 + lVar16);
            fVar36 = *(float *)((long)pvVar6 + uVar30 * 4);
            if (0 < (int)uVar1) {
              uVar18 = 0;
              do {
                fVar35 = *(float *)((long)pvVar4 + uVar18 * 4 + lVar31);
                fVar36 = fVar36 + fVar35 * *(float *)((long)pvVar27 + uVar18 * 4);
                fVar37 = fVar37 + fVar35 * *(float *)((long)pvVar28 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar1 != uVar18);
            }
            lVar21 = lVar20 * uVar30;
            uVar18 = 0;
            do {
              fVar35 = *(float *)((long)pvVar12 + uVar18 * 4);
              fVar36 = fVar36 + fVar35 * *(float *)((long)pvVar23 + uVar18 * 4);
              fVar37 = fVar37 + fVar35 * *(float *)((long)pvVar34 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar32 != uVar18);
            fVar36 = expf(-fVar36);
            fVar35 = expf(-fVar37);
            fVar37 = *(float *)((long)pvVar6 + uVar30 * 4 + lVar16 * 3);
            uVar18 = 0;
            do {
              fVar37 = fVar37 + *(float *)((long)pvVar22 + uVar18 * 4) *
                                *(float *)((long)pvVar12 + uVar18 * 4);
              uVar18 = uVar18 + 1;
            } while (uVar32 != uVar18);
            fVar37 = fVar37 / (fVar36 + 1.0) + *(float *)((long)pvVar6 + uVar30 * 4 + lVar16 * 2);
            if (0 < (int)uVar1) {
              uVar18 = 0;
              do {
                fVar37 = fVar37 + *(float *)((long)pvVar24 + uVar18 * 4) *
                                  *(float *)((long)pvVar4 + uVar18 * 4 + lVar31);
                uVar18 = uVar18 + 1;
              } while (uVar1 != uVar18);
            }
            fVar37 = tanhf(fVar37);
            *(float *)((long)pvVar14 + lVar21) = 1.0 / (fVar35 + 1.0);
            *(float *)((long)pvVar14 + lVar21 + 4) = fVar37;
            uVar30 = uVar30 + 1;
            pvVar28 = (void *)((long)pvVar28 + lVar26);
            pvVar27 = (void *)((long)pvVar27 + lVar26);
            pvVar34 = (void *)((long)pvVar34 + lVar29);
            pvVar23 = (void *)((long)pvVar23 + lVar29);
            pvVar22 = (void *)((long)pvVar22 + lVar29);
            pvVar24 = (void *)((long)pvVar24 + lVar26);
          } while (uVar30 != uVar32);
          if (0 < (int)_h) {
            uVar30 = 0;
            pfVar19 = pfVar17;
            do {
              fVar37 = (*(float *)((long)pvVar11 + uVar30 * 4) - *pfVar19) * pfVar19[-1] + *pfVar19;
              *(float *)((long)pvVar11 + uVar30 * 4) = fVar37;
              *(float *)((long)pvVar10 + uVar30 * 4 + (long)(int)uVar15 * (long)iVar3 * sVar9) =
                   fVar37;
              uVar30 = uVar30 + 1;
              pfVar19 = (float *)((long)pfVar19 + lVar20);
            } while (uVar32 != uVar30);
          }
        }
        uVar25 = uVar25 + 1;
      } while (uVar25 != uVar2);
    }
    iVar33 = 0;
  }
  piVar13 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar13 != (int *)0x0) {
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        if (local_78.data != (void *)0x0) {
          free(local_78.data);
        }
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar33;
}

Assistant:

static int gru(const Mat& bottom_blob, Mat& top_blob, int reverse, const Mat& weight_xc, const Mat& bias_c, const Mat& weight_hc, Mat& hidden_state, const Option& opt)
{
    int size = bottom_blob.w;
    int T = bottom_blob.h;

    int num_output = top_blob.w;

    // 2 x num_output
    Mat gates(2, num_output, 4u, opt.workspace_allocator);
    if (gates.empty())
        return -100;

    // unroll
    for (int t = 0; t < T; t++)
    {
        int ti = reverse ? T - 1 - t : t;

        const float* x = bottom_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            float* gates_data = gates.row(q);

            // gate reset update
            const float* bias_c_R = bias_c.row(0);
            const float* bias_c_U = bias_c.row(1);

            const float* weight_xc_R = weight_xc.row(num_output * 0 + q);
            const float* weight_xc_U = weight_xc.row(num_output * 1 + q);
            const float* weight_hc_R = weight_hc.row(num_output * 0 + q);
            const float* weight_hc_U = weight_hc.row(num_output * 1 + q);

            float R = bias_c_R[q];
            float U = bias_c_U[q];

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                R += weight_xc_R[i] * xi;
                U += weight_xc_U[i] * xi;
            }

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                R += weight_hc_R[i] * h_cont;
                U += weight_hc_U[i] * h_cont;
            }

            // sigmoid(R)
            // sigmoid(U)
            R = 1.f / (1.f + expf(-R));
            U = 1.f / (1.f + expf(-U));

            // gate new
            const float* bias_c_WN = bias_c.row(2);
            const float* bias_c_BN = bias_c.row(3);

            const float* weight_xc_N = weight_xc.row(num_output * 2 + q);
            const float* weight_hc_N = weight_hc.row(num_output * 2 + q);

            float N = bias_c_BN[q];

            for (int i = 0; i < num_output; i++)
            {
                float h_cont = hidden_state[i];

                N += weight_hc_N[i] * h_cont;
            }

            N = bias_c_WN[q] + R * N;

            for (int i = 0; i < size; i++)
            {
                float xi = x[i];

                N += weight_xc_N[i] * xi;
            }

            // tanh(N)
            N = tanhf(N);

            gates_data[0] = U;
            gates_data[1] = N;
        }

        // h_t := (1 - update) .* new + update .* h_{t-1}
        float* output_data = top_blob.row(ti);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < num_output; q++)
        {
            const float* gates_data = gates.row(q);

            float U = gates_data[0];
            float N = gates_data[1];

            float H = (1 - U) * N + U * hidden_state[q];

            hidden_state[q] = H;
            output_data[q] = H;
        }
    }

    return 0;
}